

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  cmLocalGenerator *root;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  cmGeneratedFileStream *pcVar4;
  cmMakefile *this_00;
  ulong uVar5;
  ostream *poVar6;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar7;
  cmNinjaTargetGenerator *pcVar8;
  cmGlobalNinjaGenerator *pcVar9;
  cmGlobalNinjaGenerator *this_01;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_02;
  const_reference ppcVar10;
  cmNinjaTargetGenerator *tg;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_120;
  iterator t;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string local_f8;
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  string local_b0 [8];
  string showIncludesPrefix;
  string local_88;
  allocator local_51;
  string local_50;
  string local_30;
  cmLocalNinjaGenerator *local_10;
  cmLocalNinjaGenerator *this_local;
  
  local_10 = this;
  pcVar3 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar3,&local_51);
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,pcVar3,(allocator *)(showIncludesPrefix.field_2._M_local_buf + 0xf)
            );
  cmOutputConverter::ConvertToRelativePath
            (&local_30,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_50,&local_88);
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)(showIncludesPrefix.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = std::operator==(&this->HomeRelativeOutputPath,".");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,"");
  }
  pcVar4 = GetBuildFileStream(this);
  WriteProcessedMakefile(this,(ostream *)pcVar4);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar1) {
    WriteBuildFileTop(this);
    pcVar4 = GetRulesFileStream(this);
    WritePools(this,(ostream *)pcVar4);
    this_00 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_d1);
    pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar3,&local_d2);
    std::allocator<char>::~allocator((allocator<char> *)&local_d2);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar4 = GetRulesFileStream(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"localized /showIncludes string",
                 (allocator *)
                 ((long)&targets.
                         super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmGlobalNinjaGenerator::WriteComment((ostream *)pcVar4,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&targets.
                         super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar4 = GetRulesFileStream(this);
      poVar6 = std::operator<<((ostream *)pcVar4,"msvc_deps_prefix = ");
      poVar6 = std::operator<<(poVar6,local_b0);
      std::operator<<(poVar6,"\n\n");
    }
    std::__cxx11::string::~string(local_b0);
  }
  __x = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t,__x);
  local_120._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
  while( true ) {
    tg = (cmNinjaTargetGenerator *)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
    bVar1 = __gnu_cxx::operator!=
                      (&local_120,
                       (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        *)&tg);
    if (!bVar1) break;
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_120);
    TVar2 = cmGeneratorTarget::GetType(*ppcVar7);
    if (TVar2 != INTERFACE_LIBRARY) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_120);
      pcVar8 = cmNinjaTargetGenerator::New(*ppcVar7);
      if (pcVar8 != (cmNinjaTargetGenerator *)0x0) {
        (*(pcVar8->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])();
        pcVar9 = GetGlobalNinjaGenerator(this);
        this_01 = GetGlobalNinjaGenerator(this);
        this_02 = cmGlobalNinjaGenerator::GetLocalGenerators(this_01);
        ppcVar10 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                             (this_02,0);
        root = *ppcVar10;
        ppcVar7 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_120);
        bVar1 = cmGlobalNinjaGenerator::IsExcluded(pcVar9,root,*ppcVar7);
        if (!bVar1) {
          pcVar9 = GetGlobalNinjaGenerator(this);
          ppcVar7 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_120);
          cmGlobalNinjaGenerator::AddDependencyToAll(pcVar9,*ppcVar7);
        }
        if (pcVar8 != (cmNinjaTargetGenerator *)0x0) {
          (*(pcVar8->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])();
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_120);
  }
  WriteCustomCommandBuildStatements(this);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->ConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath = "";
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream() << "msvc_deps_prefix = " << showIncludesPrefix
                                 << "\n\n";
    }
  }

  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    if ((*t)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmNinjaTargetGenerator* tg = cmNinjaTargetGenerator::New(*t);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(
            this->GetGlobalNinjaGenerator()->GetLocalGenerators()[0], *t)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(*t);
      }
      delete tg;
    }
  }

  this->WriteCustomCommandBuildStatements();
}